

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hawktracer.cpp
# Opt level: O1

void ht_hash_map_for_each
               (HT_HashMap *hash_map,_func_HT_Boolean_uint64_t_char_ptr_void_ptr *callback,void *ud)

{
  HT_Boolean HVar1;
  long lVar2;
  ulong uVar3;
  bool bVar4;
  
  lVar2 = 0;
  do {
    bVar4 = hash_map->buckets[lVar2].key_bag.size == 0;
    if (!bVar4) {
      HVar1 = (*callback)(*hash_map->buckets[lVar2].key_bag.data,
                          (char *)*hash_map->buckets[lVar2].value_bag.data,ud);
      if (HVar1 == 0) {
        bVar4 = false;
      }
      else {
        uVar3 = 1;
        do {
          bVar4 = hash_map->buckets[lVar2].key_bag.size <= uVar3;
          if (bVar4) break;
          HVar1 = (*callback)(hash_map->buckets[lVar2].key_bag.data[uVar3],
                              (char *)hash_map->buckets[lVar2].value_bag.data[uVar3],ud);
          uVar3 = uVar3 + 1;
        } while (HVar1 != 0);
      }
    }
    if ((!bVar4) || (lVar2 = lVar2 + 1, lVar2 == 0x200)) {
      return;
    }
  } while( true );
}

Assistant:

void ht_hash_map_for_each(HT_HashMap* hash_map, HT_Boolean(*callback)(uint64_t, const char*, void* ud), void* ud)
{
    for (size_t i = 0; i < BUCKET_COUNT(hash_map); i++)
    {
        if (!ht_hash_bucket_for_each(&hash_map->buckets[i], callback, ud))
        {
            return;
        }
    }
}